

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_invoke_helpers.hpp
# Opt level: O0

void asio_handler_invoke_helpers::
     invoke<asio::detail::binder2<asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,asio::stream_socket_service<asio::ip::tcp>>,asio::basic_streambuf_ref<std::allocator<char>>,asio::detail::transfer_exactly_t,tonk::gateway::HTTPRequester::ContinueReadingBody()::__0>,std::error_code,unsigned_long>,tonk::gateway::HTTPRequester::ContinueReadingBody()::__0>
               (binder2<asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>,_std::error_code,_unsigned_long>
                *function,anon_class_8_1_8991fb9c_for_handler_ *context)

{
  undefined8 in_RSI;
  binder2<asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>,_std::error_code,_unsigned_long>
  *in_RDI;
  
  asio::
  asio_handler_invoke<asio::detail::binder2<asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,asio::stream_socket_service<asio::ip::tcp>>,asio::basic_streambuf_ref<std::allocator<char>>,asio::detail::transfer_exactly_t,tonk::gateway::HTTPRequester::ContinueReadingBody()::__0>,std::error_code,unsigned_long>>
            (in_RDI,in_RSI);
  return;
}

Assistant:

inline void invoke(Function& function, Context& context)
{
#if !defined(ASIO_HAS_HANDLER_HOOKS)
  Function tmp(function);
  tmp();
#else
  using asio::asio_handler_invoke;
  asio_handler_invoke(function, asio::detail::addressof(context));
#endif
}